

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_medcon_external(CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  CImg<char> *pCVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  CImgArgumentException *this_00;
  CImgIOException *pCVar10;
  char *pcVar11;
  ulong uVar12;
  CImg<char> command;
  CImg<char> body;
  CImg<char> filename_tmp;
  CImg<char> local_70;
  CImg<char> local_50;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar11 = "non-";
    if (this->_is_shared != false) {
      pcVar11 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_medcon_external(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar11,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((*filename != '-') || ((pFVar3 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar3 = fopen(filename,"rb");
  }
  if (pFVar3 == (FILE *)0x0) {
    pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar10,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"rb");
    __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  fclose(pFVar3);
  CImg<char>::CImg(&command,0x400,1,1,1);
  CImg<char>::CImg(&filename_tmp,0x100,1,1,1);
  CImg<char>::CImg(&body,0x100,1,1,1);
  if ((*filename != '-') || ((pFVar3 = _stdin, filename[1] != '.' && (filename[1] != '\0')))) {
    pFVar3 = fopen(filename,"r");
  }
  if (pFVar3 == (FILE *)0x0) {
    pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgIOException::CImgIOException
              (pCVar10,"cimg::fopen(): Failed to open file \'%s\' with mode \'%s\'.",filename,"r");
    __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
  }
  if (((_stdin != pFVar3) && (_stdout != pFVar3)) && (uVar1 = fclose(pFVar3), uVar1 != 0)) {
    cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar1);
  }
  while( true ) {
    pcVar11 = filename_tmp._data;
    uVar12 = (ulong)filename_tmp._width;
    cimg::filenamerand();
    snprintf(pcVar11,uVar12,"%s.hdr");
    pFVar3 = fopen(filename_tmp._data,"rb");
    pcVar11 = command._data;
    if (pFVar3 == (FILE *)0x0) break;
    if (((_stdin != pFVar3) && (_stdout != pFVar3)) && (uVar1 = fclose(pFVar3), uVar1 != 0)) {
      cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar1);
    }
  }
  uVar12 = (ulong)command._width;
  pcVar4 = cimg::medcon_path((char *)0x0,false);
  CImg<char>::string(&local_50,filename_tmp._data,true,false);
  pCVar5 = CImg<char>::_system_strescape(&local_50);
  pcVar7 = pCVar5->_data;
  sVar6 = strlen(filename);
  CImg<char>::CImg(&local_70,filename,(int)sVar6 + 1,1,1,1,false);
  pCVar5 = CImg<char>::_system_strescape(&local_70);
  snprintf(pcVar11,uVar12,"%s -w -c anlz -o \"%s\" -f \"%s\"",pcVar4,pcVar7,pCVar5->_data);
  if ((local_70._is_shared == false) && (local_70._data != (char *)0x0)) {
    operator_delete__(local_70._data);
  }
  if ((local_50._is_shared == false) && (local_50._data != (char *)0x0)) {
    operator_delete__(local_50._data);
  }
  pcVar11 = command._data;
  sVar6 = strlen(command._data);
  uVar12 = sVar6 & 0xffffffff;
  if (uVar12 != 0) {
    pcVar7 = (char *)operator_new__((ulong)((int)sVar6 + 0x10));
    strncpy(pcVar7,pcVar11,uVar12);
    builtin_strncpy(pcVar7 + uVar12," 2> /dev/null",0xe);
    system(pcVar7);
    operator_delete__(pcVar7);
  }
  pcVar7 = filename_tmp._data;
  pcVar11 = body._data;
  pcVar4 = filename_tmp._data;
  if (filename_tmp._data == (char *)0x0) {
    if (body._data != (char *)0x0) {
      *body._data = '\0';
    }
  }
  else {
    do {
      pcVar9 = pcVar4;
      pcVar8 = strchr(pcVar9,0x2e);
      pcVar4 = pcVar8 + 1;
    } while (pcVar7 <= pcVar8 + 1);
    if (pcVar9 == pcVar7) {
      if (pcVar11 != (char *)0x0) {
        strcpy(pcVar11,pcVar7);
      }
    }
    else if (pcVar11 != (char *)0x0) {
      uVar1 = (int)pcVar9 + ~(uint)pcVar7;
      if (uVar1 != 0) {
        memcpy(pcVar11,pcVar7,(ulong)uVar1);
      }
      pcVar11[uVar1] = '\0';
    }
  }
  snprintf(command._data,(ulong)command._width,"%s.hdr");
  pFVar3 = fopen(command._data,"rb");
  if (pFVar3 == (FILE *)0x0) {
    snprintf(command._data,(ulong)command._width,"m000-%s.hdr");
    pFVar3 = fopen(command._data,"rb");
    if (pFVar3 == (FILE *)0x0) {
      pCVar10 = (CImgIOException *)__cxa_allocate_exception(0x10);
      pcVar11 = "non-";
      if (this->_is_shared != false) {
        pcVar11 = "";
      }
      CImgIOException::CImgIOException
                (pCVar10,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_medcon_external(): Failed to load file \'%s\' with external command \'medcon\'."
                 ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                 (ulong)this->_spectrum,this->_data,pcVar11,"unsigned char",filename);
      __cxa_throw(pCVar10,&CImgIOException::typeinfo,CImgException::~CImgException);
    }
  }
  if (((_stdin != pFVar3) && (_stdout != pFVar3)) && (iVar2 = fclose(pFVar3), iVar2 != 0)) {
    cimg::warn("cimg::fclose(): Error code %d returned during file closing.");
  }
  _load_analyze(this,(FILE *)0x0,command._data,(float *)0x0);
  remove(command._data);
  pcVar7 = body._data;
  pcVar11 = command._data;
  pcVar4 = command._data;
  if (command._data == (char *)0x0) {
    if (body._data != (char *)0x0) {
      *body._data = '\0';
    }
  }
  else {
    do {
      pcVar9 = pcVar4;
      pcVar8 = strchr(pcVar9,0x2e);
      pcVar4 = pcVar8 + 1;
    } while (pcVar11 <= pcVar8 + 1);
    if (pcVar9 == pcVar11) {
      if (pcVar7 != (char *)0x0) {
        strcpy(pcVar7,pcVar11);
      }
    }
    else if (pcVar7 != (char *)0x0) {
      uVar1 = (int)pcVar9 + ~(uint)pcVar11;
      if (uVar1 != 0) {
        memcpy(pcVar7,pcVar11,(ulong)uVar1);
      }
      pcVar7[uVar1] = '\0';
    }
  }
  snprintf(command._data,(ulong)command._width,"%s.img",body._data);
  remove(command._data);
  if ((body._is_shared == false) && (body._data != (char *)0x0)) {
    operator_delete__(body._data);
  }
  if ((filename_tmp._is_shared == false) && (filename_tmp._data != (char *)0x0)) {
    operator_delete__(filename_tmp._data);
  }
  if ((command._is_shared == false) && (command._data != (char *)0x0)) {
    operator_delete__(command._data);
  }
  return this;
}

Assistant:

CImg<T>& load_medcon_external(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_medcon_external(): Specified filename is (null).",
                                    cimg_instance);
      std::fclose(cimg::fopen(filename,"rb"));            // Check if file exists.
      CImg<charT> command(1024), filename_tmp(256), body(256);
      cimg::fclose(cimg::fopen(filename,"r"));
      std::FILE *file = 0;
      do {
        cimg_snprintf(filename_tmp,filename_tmp._width,"%s.hdr",cimg::filenamerand());
        if ((file=std::fopen(filename_tmp,"rb"))!=0) cimg::fclose(file);
      } while (file);
      cimg_snprintf(command,command._width,"%s -w -c anlz -o \"%s\" -f \"%s\"",
                    cimg::medcon_path(),
                    CImg<charT>::string(filename_tmp)._system_strescape().data(),
                    CImg<charT>::string(filename)._system_strescape().data());
      cimg::system(command);
      cimg::split_filename(filename_tmp,body);

      cimg_snprintf(command,command._width,"%s.hdr",body._data);
      file = std::fopen(command,"rb");
      if (!file) {
        cimg_snprintf(command,command._width,"m000-%s.hdr",body._data);
        file = std::fopen(command,"rb");
        if (!file) {
          throw CImgIOException(_cimg_instance
                                "load_medcon_external(): Failed to load file '%s' with external command 'medcon'.",
                                cimg_instance,
                                filename);
        }
      }
      cimg::fclose(file);
      load_analyze(command);
      std::remove(command);
      cimg::split_filename(command,body);
      cimg_snprintf(command,command._width,"%s.img",body._data);
      std::remove(command);
      return *this;
    }